

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::beta_dist<double>>(beta_dist<double> *d)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  param_type *P;
  beta_dist<double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  beta_dist<double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd88;
  Flags in_stack_fffffffffffffd8c;
  undefined6 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  SourceLineInfo *this;
  AssertionHandler *this_00;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  ExprLhs<bool> *in_stack_fffffffffffffdb8;
  AssertionHandler *in_stack_fffffffffffffdc0;
  SourceLineInfo local_238;
  undefined1 in_stack_fffffffffffffdd8 [16];
  beta_dist<double> local_1d0;
  stringstream local_1a8 [16];
  AssertionHandler local_198 [5];
  param_type local_20;
  beta_dist<double> *local_8;
  
  local_8 = in_RDI;
  trng::beta_dist<double>::param_type::param_type
            ((param_type *)
             CONCAT17(in_stack_fffffffffffffd97,
                      CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)));
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = local_198;
  P = trng::beta_dist<double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),P);
  trng::operator>>(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
  trng::beta_dist<double>::beta_dist(&local_1d0,&local_20);
  operator____catch_sr
            ((char *)CONCAT17(in_stack_fffffffffffffd97,
                              CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this = &local_238;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffffdb0;
  capturedExpression.m_start = (char *)P;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffffdb7;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffd97,
                      CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
             capturedExpression,in_stack_fffffffffffffd8c);
  uVar1 = trng::operator==((beta_dist<double> *)
                           CONCAT17(in_stack_fffffffffffffd97,
                                    CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
                           (beta_dist<double> *)
                           CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffd90)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffd90)));
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}